

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::DrawTest::iterate(DrawTest *this)

{
  Storage *this_00;
  int iVar1;
  IndexType IVar2;
  Storage SVar3;
  pointer pDVar4;
  pointer pAVar5;
  pointer pAVar6;
  undefined8 uVar7;
  Double DVar8;
  uint6 uVar9;
  InputType IVar10;
  OutputType OVar11;
  Usage usage;
  undefined8 uVar12;
  int iVar13;
  bool bVar14;
  Byte BVar15;
  Ubyte UVar16;
  Short SVar17;
  Half HVar18;
  Ushort UVar19;
  int componentNdx_1;
  CompatibilityTestType CVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  deUint32 dVar24;
  deUint32 dVar25;
  deUint32 dVar26;
  Int IVar27;
  Fixed FVar28;
  Uint UVar29;
  uint uVar30;
  size_t testIterations;
  DrawTestSpec *spec;
  ulong uVar31;
  ulong uVar32;
  AttributeArray *pAVar33;
  AttributeArray *this_01;
  bool bVar34;
  bool bVar35;
  Uint min;
  Uint max;
  uint uVar36;
  long lVar37;
  int iVar38;
  IterateResult IVar39;
  int componentNdx_21;
  TestLog *log;
  DrawTest *this_02;
  size_t sVar40;
  long lVar41;
  int componentNdx;
  uint uVar42;
  ulong uVar43;
  int componentNdx_3;
  long lVar44;
  int i;
  deUint32 dVar45;
  long lVar46;
  char *pcVar47;
  int componentNdx_9;
  int i_00;
  uint *puVar48;
  ulong uVar49;
  bool bVar50;
  float coordScale;
  float colorScale;
  float fVar51;
  Float FVar52;
  float fVar53;
  GLValue GVar54;
  GLValue GVar55;
  int local_2e0;
  char *local_2d0;
  ulong local_2c8;
  char *local_2b8;
  Half components [4];
  undefined8 local_288;
  float afStack_280 [6];
  Random random;
  Vec4 retVal;
  int local_210;
  Half local_1fc;
  Half local_1fa;
  ulong local_1f8;
  TestContext **local_1f0;
  long local_1e8;
  ulong local_1e0;
  IterationLogSectionEmitter sectionEmitter;
  AttributeSpec attribSpec;
  
  iVar1 = this->m_iteration;
  bVar50 = (long)iVar1 == 0;
  iVar38 = iVar1 % 2;
  pDVar4 = (this->m_specs).
           super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar41 = (long)(this->m_specs).
                 super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4;
  testIterations = lVar41 / 0x50;
  sVar40 = (size_t)(iVar1 / 2);
  spec = pDVar4 + sVar40;
  if (iVar38 == 0 && !bVar50) {
    pAVar6 = (spec->attribs).
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar44 = (long)(spec->attribs).
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6;
    lVar46 = lVar44 / 0x28;
    pAVar5 = spec[-1].attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar44 == (long)spec[-1].attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5) {
      lVar44 = 4;
      do {
        bVar50 = lVar46 != 0;
        lVar46 = lVar46 + -1;
        if ((!bVar50) ||
           (*(char *)((long)&pAVar6->instanceDivisor + lVar44 + 1) !=
            *(char *)((long)&pAVar5->instanceDivisor + lVar44 + 1))) goto LAB_014fc627;
        uVar30 = *(uint *)((long)&pAVar6->inputType + lVar44);
        if ((3 < uVar30) || (3 < *(uint *)((long)&pAVar5->inputType + lVar44))) {
          if (0xb < uVar30) goto LAB_014fc627;
          if ((0x1d0U >> (uVar30 & 0x1f) & 1) == 0) {
            if ((0xe20U >> (uVar30 & 0x1f) & 1) == 0) goto LAB_014fc627;
          }
          else {
            uVar21 = *(uint *)((long)&pAVar5->inputType + lVar44);
            if ((uVar21 < 9) && ((0x1d0U >> (uVar21 & 0x1f) & 1) != 0)) goto LAB_014fc77a;
            if (uVar30 != 5) goto LAB_014fc627;
          }
          uVar30 = *(uint *)((long)&pAVar5->inputType + lVar44);
          if ((0xb < uVar30) || ((0xe20U >> (uVar30 & 0x1f) & 1) == 0)) goto LAB_014fc627;
        }
LAB_014fc77a:
        lVar44 = lVar44 + 0x28;
      } while( true );
    }
    log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    bVar50 = true;
LAB_014fc7c0:
    local_1f0 = &(this->super_TestCase).super_TestNode.m_testCtx;
    anon_unknown_1::IterationLogSectionEmitter::IterationLogSectionEmitter
              (&sectionEmitter,log,sVar40,testIterations,
               (this->m_iteration_descriptions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + sVar40,lVar41 != 0x50);
    uVar30 = (uint)*(uint6 *)(gls::(anonymous_namespace)::
                              getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
                             (long)(int)spec->drawMethod * 6);
    this_02 = (DrawTest *)(ulong)uVar30;
    uVar9 = *(uint6 *)(gls::(anonymous_namespace)::
                       getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
                      (long)(int)spec->drawMethod * 6);
    if (spec->primitive < PRIMITIVE_LAST) {
      local_1e8 = (long)spec->primitiveCount;
      switch(spec->primitive) {
      case PRIMITIVE_POINTS:
        break;
      case PRIMITIVE_TRIANGLES:
        local_1e8 = local_1e8 * 3;
        break;
      default:
        local_1e8 = local_1e8 + 2;
        break;
      case PRIMITIVE_LINES:
        local_1e8 = local_1e8 * 2;
        break;
      case PRIMITIVE_LINE_STRIP:
        local_1e8 = local_1e8 + 1;
        break;
      case PRIMITIVE_LINE_LOOP:
        if (spec->primitiveCount == 1) {
          local_1e8 = 2;
        }
        break;
      case PRIMITIVE_LINES_ADJACENCY:
        local_1e8 = local_1e8 << 2;
        break;
      case PRIMITIVE_LINE_STRIP_ADJACENCY:
        local_1e8 = local_1e8 + 3;
        break;
      case PRIMITIVE_TRIANGLES_ADJACENCY:
        local_1e8 = local_1e8 * 6;
        break;
      case PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
        local_1e8 = local_1e8 * 2 + 4;
      }
    }
    else {
      local_1e8 = 0;
    }
    local_1f8._0_4_ = (uint)uVar9;
    min.m_value = 0;
    if (((uint)local_1f8 >> 0x10 & 1) != 0) {
      min.m_value = spec->indexMin;
    }
    iVar38 = 0;
    if (((uint)local_1f8 >> 0x18 & 1) != 0) {
      iVar38 = spec->first;
    }
    uVar21 = spec->baseVertex;
    uVar36 = 0;
    if (0 < (int)uVar21) {
      uVar36 = uVar21;
    }
    uVar21 = (int)uVar21 >> 0x1f & -uVar21;
    if ((uVar9 >> 0x20 & 1) == 0) {
      uVar21 = 0;
    }
    local_1e0 = (ulong)uVar21;
    uVar21 = iVar38 + -1 + min.m_value + (int)local_1e8;
    if (((uint)local_1f8 >> 0x10 & 1) != 0) {
      uVar42 = spec->indexMax;
      if ((int)uVar42 < (int)uVar21) {
        uVar21 = uVar42;
      }
      if ((int)uVar42 < 0) {
        uVar21 = 0;
      }
    }
    max.m_value = 0;
    if (0 < (int)uVar21) {
      max.m_value = uVar21;
    }
    local_1f8 = (ulong)uVar9;
    coordScale = getCoordScale(this_02,spec);
    colorScale = getColorScale(this_02,spec);
    attribSpec._0_8_ = (*local_1f0)->m_log;
    this_00 = &attribSpec.storage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    DrawTestSpec::getMultilineDesc_abi_cxx11_((string *)&random,spec);
    std::operator<<((ostream *)this_00,(string *)&random);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&attribSpec,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&random);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    attribSpec._0_8_ = (*local_1f0)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&attribSpec.storage);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&attribSpec,(EndMessageToken *)&tcu::TestLog::EndMessage);
    uVar31 = local_1e8 + (int)min.m_value +
             (long)iVar38 + (ulong)((uint)((long)(local_1f8 << 0x1f) >> 0x3f) & uVar36);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&attribSpec.storage);
    AttributePack::clearArrays(this->m_glArrayPack);
    AttributePack::clearArrays(this->m_rrArrayPack);
    for (lVar41 = 0;
        pAVar6 = (spec->attribs).
                 super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar41 < (int)(((long)(spec->attribs).
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6) / 0x28);
        lVar41 = lVar41 + 1) {
      pAVar5 = pAVar6 + lVar41;
      uVar7._0_4_ = pAVar5->instanceDivisor;
      uVar7._4_1_ = pAVar5->useDefaultAttribute;
      uVar7._5_1_ = pAVar5->additionalPositionAttribute;
      uVar7._6_1_ = pAVar5->bgraComponentOrder;
      uVar7._7_1_ = pAVar5->field_0x27;
      pAVar5 = pAVar6 + lVar41;
      attribSpec.inputType = pAVar5->inputType;
      attribSpec.outputType = pAVar5->outputType;
      attribSpec.storage = pAVar5->storage;
      attribSpec.usage = pAVar5->usage;
      pAVar6 = pAVar6 + lVar41;
      attribSpec.componentCount = pAVar6->componentCount;
      attribSpec.offset = pAVar6->offset;
      attribSpec._24_8_ = *(undefined8 *)(&pAVar6->componentCount + 2);
      attribSpec._32_8_ = uVar7;
      iVar38 = DrawTestSpec::AttributeSpec::hash(&attribSpec);
      iVar22 = DrawTestSpec::hash(spec);
      uVar12 = attribSpec._16_8_;
      IVar10 = attribSpec.inputType;
      i_00 = (int)lVar41;
      if (uVar7._4_1_ == true) {
        deRandom_init(&random.m_rnd,iVar22 * 100 + i_00 + iVar38 * 10);
        if (IVar10 == INPUTTYPE_UNSIGNED_INT) {
          tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&retVal);
          for (lVar46 = 0; lVar46 != 4; lVar46 = lVar46 + 1) {
            fVar51 = (float)deRandom_getUint32(&random.m_rnd);
            retVal.m_data[lVar46] = fVar51;
          }
LAB_014fce63:
          local_288._0_4_ = retVal.m_data[0];
          local_288._4_4_ = retVal.m_data[1];
          afStack_280[0] = retVal.m_data[2];
          afStack_280[1] = retVal.m_data[3];
        }
        else {
          if (IVar10 == INPUTTYPE_INT) {
            tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&retVal);
            for (lVar46 = 0; lVar46 != 4; lVar46 = lVar46 + 1) {
              fVar51 = (float)deRandom_getUint32(&random.m_rnd);
              retVal.m_data[lVar46] = fVar51;
            }
            goto LAB_014fce63;
          }
          local_288._0_4_ = 1.0;
          local_288._4_4_ = 1.0;
          afStack_280[0] = 1.0;
          afStack_280[1] = 1.0;
          if (IVar10 == INPUTTYPE_FLOAT) {
            tcu::Vector<float,_4>::Vector(&retVal);
            for (lVar46 = 0; lVar46 != 4; lVar46 = lVar46 + 1) {
              fVar51 = deRandom_getFloat(&random.m_rnd);
              retVal.m_data[lVar46] = fVar51;
            }
            goto LAB_014fce63;
          }
        }
        AttributePack::newArray(this->m_glArrayPack,STORAGE_USER);
        AttributePack::newArray(this->m_rrArrayPack,STORAGE_USER);
        pAVar33 = AttributePack::getArray(this->m_glArrayPack,i_00);
        OVar11 = attribSpec.outputType;
        iVar38 = attribSpec.componentCount;
        pAVar33->m_componentCount = attribSpec.componentCount;
        pAVar33->m_bound = false;
        pAVar33->m_inputType = IVar10;
        pAVar33->m_outputType = attribSpec.outputType;
        pAVar33->m_normalize = false;
        pAVar33->m_stride = 0;
        pAVar33->m_offset = 0;
        *(undefined8 *)&(pAVar33->m_defaultAttrib).v = local_288;
        *(undefined8 *)((long)&(pAVar33->m_defaultAttrib).v + 8) = afStack_280._0_8_;
        pAVar33->m_instanceDivisor = 0;
        bVar34 = (bool)(lVar41 == 0 | uVar7._5_1_ & 1U);
        pAVar33->m_isPositionAttr = bVar34;
        pAVar33->m_bgraOrder = false;
        pAVar33 = AttributePack::getArray(this->m_rrArrayPack,i_00);
        pAVar33->m_componentCount = iVar38;
        pAVar33->m_bound = false;
        pAVar33->m_inputType = IVar10;
        pAVar33->m_outputType = OVar11;
        pAVar33->m_normalize = false;
        pAVar33->m_stride = 0;
        pAVar33->m_offset = 0;
        *(undefined8 *)&(pAVar33->m_defaultAttrib).v = local_288;
        *(undefined8 *)((long)&(pAVar33->m_defaultAttrib).v + 8) = afStack_280._0_8_;
        pAVar33->m_instanceDivisor = 0;
        pAVar33->m_isPositionAttr = bVar34;
        pAVar33->m_bgraOrder = false;
      }
      else {
        uVar21 = attribSpec.componentCount;
        lVar44 = (long)attribSpec.componentCount;
        iVar23 = DrawTestSpec::inputTypeSize::size[(int)attribSpec.inputType] *
                 attribSpec.componentCount;
        lVar46 = (long)attribSpec.stride;
        if ((long)attribSpec.stride == 0) {
          lVar46 = (long)iVar23;
        }
        local_2c8 = uVar31;
        if ((0 < attribSpec.instanceDivisor & (byte)(local_1f8 >> 8)) == 1) {
          local_2c8 = (ulong)(spec->instanceCount / attribSpec.instanceDivisor + 1);
        }
        if ((((uint)local_1f8 >> 0x10 & 1) != 0) &&
           (uVar32 = (ulong)(spec->indexMax + 1), local_2c8 <= uVar32)) {
          local_2c8 = uVar32;
        }
        dVar45 = iVar38 + i_00 + iVar22 * 100;
        iVar38 = attribSpec.offset;
        lVar37 = (long)attribSpec.offset;
        local_2e0 = (int)lVar46;
        uVar36 = (uint)local_2c8;
        if ((attribSpec.inputType & ~INPUTTYPE_FIXED) == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 +
                                                        attribSpec.offset) + 4);
          deRandom_init(&random.m_rnd,dVar45);
          puVar48 = (uint *)(local_2d0 + lVar37);
          uVar32 = 0;
          if (0 < (int)uVar36) {
            uVar32 = local_2c8 & 0xffffffff;
          }
          while (iVar38 = (int)uVar32, uVar32 = (ulong)(iVar38 - 1), iVar38 != 0) {
            dVar45 = deRandom_getUint32(&random.m_rnd);
            dVar24 = deRandom_getUint32(&random.m_rnd);
            dVar25 = deRandom_getUint32(&random.m_rnd);
            dVar26 = deRandom_getUint32(&random.m_rnd);
            *puVar48 = (dVar24 & 0x3ff) << 10 | (dVar25 & 0x3ff) << 0x14 | dVar26 << 0x1e |
                       dVar45 & 0x3ff;
            puVar48 = (uint *)((long)puVar48 + lVar46);
          }
        }
        else {
          switch(attribSpec._0_8_ & 0xffffffff) {
          case 0:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_FLOAT);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_FLOAT);
            local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 + iVar38) +
                                               lVar44 * 4);
            deRandom_init((deRandom *)&retVal,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar32 = 0;
            if (0 < (int)uVar21) {
              uVar32 = uVar12 & 0xffffffff;
            }
            uVar43 = 0;
            iVar38 = 0;
            if (0 < (int)uVar36) {
              uVar43 = local_2c8 & 0xffffffff;
              iVar38 = 0;
            }
            for (; iVar38 != (int)uVar43; iVar38 = iVar38 + 1) {
              for (uVar49 = 0; uVar32 != uVar49; uVar49 = uVar49 + 1) {
                FVar52 = gls::(anonymous_namespace)::
                         getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                                   ((deRandom *)&retVal,(Float)GVar54.type,GVar55.field_1._0_4_);
                *(float *)(components + uVar49 * 2) = FVar52.m_value;
                if ((iVar38 != 0) && (ABS(FVar52.m_value - (float)(&random.m_rnd.x)[uVar49]) < 4.0))
                {
                  FVar52 = gls::(anonymous_namespace)::
                           getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                                     ((deRandom *)&retVal,(Float)GVar54.type,GVar55.field_1._0_4_);
                  *(float *)(components + uVar49 * 2) = FVar52.m_value;
                }
              }
              for (uVar49 = 0; uVar32 != uVar49; uVar49 = uVar49 + 1) {
                (&random.m_rnd.x)[uVar49] = *(deUint32 *)(components + uVar49 * 2);
              }
              for (uVar49 = 0; uVar32 != uVar49; uVar49 = uVar49 + 1) {
                *(undefined4 *)(pcVar47 + uVar49 * 4) = *(undefined4 *)(components + uVar49 * 2);
              }
              pcVar47 = pcVar47 + lVar46;
            }
            break;
          case 1:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_FIXED);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_FIXED);
            local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 + iVar38) +
                                               lVar44 * 4);
            deRandom_init((deRandom *)&retVal,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar43 = 0;
            uVar32 = uVar12 & 0xffffffff;
            if ((int)uVar21 < 1) {
              uVar32 = uVar43;
            }
            uVar21 = 0;
            if (0 < (int)uVar36) {
              uVar21 = uVar36;
            }
            while (uVar36 = (uint)uVar43, uVar36 != uVar21) {
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                FVar28 = anon_unknown_1::getRandom<deqp::gls::(anonymous_namespace)::GLValue::Fixed>
                                   ((deRandom *)&retVal,(Fixed)GVar54.type,GVar55.field_1._0_4_);
                *(deInt32 *)(components + uVar43 * 2) = FVar28.m_value;
                if ((uVar36 != 0) && ((FVar28.m_value - (&random.m_rnd.x)[uVar43] & 0x7ffc) == 0)) {
                  FVar28 = anon_unknown_1::
                           getRandom<deqp::gls::(anonymous_namespace)::GLValue::Fixed>
                                     ((deRandom *)&retVal,(Fixed)GVar54.type,GVar55.field_1._0_4_);
                  *(deInt32 *)(components + uVar43 * 2) = FVar28.m_value;
                }
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                (&random.m_rnd.x)[uVar43] = *(deUint32 *)(components + uVar43 * 2);
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(undefined4 *)(pcVar47 + uVar43 * 4) = *(undefined4 *)(components + uVar43 * 2);
              }
              pcVar47 = pcVar47 + lVar46;
              uVar43 = (ulong)(uVar36 + 1);
            }
            break;
          case 2:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_DOUBLE);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_DOUBLE);
            local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 + iVar38) +
                                               lVar44 * 8);
            deRandom_init((deRandom *)components,dVar45);
            pcVar47 = local_2d0 + lVar37;
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            uVar32 = (ulong)uVar21;
            uVar43 = 0;
            iVar38 = 0;
            if (0 < (int)uVar36) {
              uVar43 = local_2c8 & 0xffffffff;
              iVar38 = 0;
            }
            for (; iVar38 != (int)uVar43; iVar38 = iVar38 + 1) {
              for (uVar49 = 0; uVar32 != uVar49; uVar49 = uVar49 + 1) {
                DVar8 = gls::(anonymous_namespace)::
                        getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<double>>
                                  ((deRandom *)components,GVar54._0_8_,GVar55.field_1.d);
                *(double *)(retVal.m_data + uVar49 * 2) = DVar8.m_value;
                if ((iVar38 != 0) &&
                   (ABS((float)(DVar8.m_value - *(double *)(&random.m_rnd.x + uVar49 * 2))) < 4.0))
                {
                  DVar8 = gls::(anonymous_namespace)::
                          getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<double>>
                                    ((deRandom *)components,GVar54._0_8_,GVar55.field_1.d);
                  *(double *)(retVal.m_data + uVar49 * 2) = DVar8.m_value;
                }
              }
              for (uVar49 = 0; uVar32 != uVar49; uVar49 = uVar49 + 1) {
                *(undefined8 *)(&random.m_rnd.x + uVar49 * 2) =
                     *(undefined8 *)(retVal.m_data + uVar49 * 2);
              }
              for (uVar49 = 0; uVar32 != uVar49; uVar49 = uVar49 + 1) {
                *(undefined8 *)(pcVar47 + uVar49 * 8) = *(undefined8 *)(retVal.m_data + uVar49 * 2);
              }
              pcVar47 = pcVar47 + lVar46;
            }
            break;
          case 3:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_BYTE);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_BYTE);
            local_2d0 = (char *)operator_new__((int)((uVar36 - 1) * local_2e0 + iVar38) + lVar44);
            deRandom_init(&random.m_rnd,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar42 = 0;
            uVar32 = 0;
            if (0 < (int)uVar21) {
              uVar32 = uVar12 & 0xffffffff;
            }
            uVar21 = 0;
            if (0 < (int)uVar36) {
              uVar21 = uVar36;
            }
            for (; uVar42 != uVar21; uVar42 = uVar42 + 1) {
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                local_288._0_1_ = GVar54.type._0_1_;
                local_2b8._0_1_ = GVar55.field_1._0_1_;
                BVar15 = gls::(anonymous_namespace)::
                         getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<signed_char>>
                                   (&random.m_rnd,(Byte)local_288._0_1_,(Byte)local_2b8._0_1_);
                *(char *)((long)&components[0].m_value + uVar43) = BVar15.m_value;
                if ((uVar42 != 0) &&
                   ((BVar15.m_value - *(char *)((long)retVal.m_data + uVar43) & 0x7cU) == 0)) {
                  BVar15 = gls::(anonymous_namespace)::
                           getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<signed_char>>
                                     (&random.m_rnd,(Byte)local_288._0_1_,(Byte)local_2b8._0_1_);
                  *(char *)((long)&components[0].m_value + uVar43) = BVar15.m_value;
                }
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(undefined1 *)((long)retVal.m_data + uVar43) =
                     *(undefined1 *)((long)&components[0].m_value + uVar43);
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                pcVar47[uVar43] = *(char *)((long)&components[0].m_value + uVar43);
              }
              pcVar47 = pcVar47 + lVar46;
            }
            break;
          case 4:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_SHORT);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_SHORT);
            local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 + iVar38) +
                                               lVar44 * 2);
            deRandom_init(&random.m_rnd,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar42 = 0;
            uVar32 = 0;
            if (0 < (int)uVar21) {
              uVar32 = uVar12 & 0xffffffff;
            }
            uVar21 = 0;
            if (0 < (int)uVar36) {
              uVar21 = uVar36;
            }
            for (; uVar42 != uVar21; uVar42 = uVar42 + 1) {
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                SVar17 = gls::(anonymous_namespace)::
                         getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                                   (&random.m_rnd,(short)GVar54.type,GVar55.field_1._0_2_);
                components[uVar43].m_value = SVar17.m_value;
                if ((uVar42 != 0) &&
                   ((SVar17.m_value - *(short *)((long)retVal.m_data + uVar43 * 2) & 0x7c00U) == 0))
                {
                  SVar17 = gls::(anonymous_namespace)::
                           getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                                     (&random.m_rnd,(short)GVar54.type,GVar55.field_1._0_2_);
                  components[uVar43].m_value = SVar17.m_value;
                }
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(deFloat16 *)((long)retVal.m_data + uVar43 * 2) = components[uVar43].m_value;
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(deFloat16 *)(pcVar47 + uVar43 * 2) = components[uVar43].m_value;
              }
              pcVar47 = pcVar47 + lVar46;
            }
            break;
          case 5:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_BYTE);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE);
            local_2d0 = (char *)operator_new__((int)((uVar36 - 1) * local_2e0 + iVar38) + lVar44);
            deRandom_init(&random.m_rnd,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar42 = 0;
            if ((int)uVar21 < 1) {
              uVar21 = uVar42;
            }
            uVar32 = (ulong)uVar21;
            uVar21 = 0;
            if (0 < (int)uVar36) {
              uVar21 = uVar36;
            }
            for (; uVar42 != uVar21; uVar42 = uVar42 + 1) {
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                local_288._0_1_ = GVar54.type._0_1_;
                local_2b8._0_1_ = GVar55.field_1._0_1_;
                UVar16 = gls::(anonymous_namespace)::
                         getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_char>>
                                   (&random.m_rnd,local_288._0_1_,local_2b8._0_1_);
                *(uchar *)((long)&components[0].m_value + uVar43) = UVar16.m_value;
                if ((uVar42 != 0) &&
                   ((byte)(UVar16.m_value - *(char *)((long)retVal.m_data + uVar43)) < 8)) {
                  UVar16 = gls::(anonymous_namespace)::
                           getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_char>>
                                     (&random.m_rnd,local_288._0_1_,local_2b8._0_1_);
                  *(uchar *)((long)&components[0].m_value + uVar43) = UVar16.m_value;
                }
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(undefined1 *)((long)retVal.m_data + uVar43) =
                     *(undefined1 *)((long)&components[0].m_value + uVar43);
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                pcVar47[uVar43] = *(char *)((long)&components[0].m_value + uVar43);
              }
              pcVar47 = pcVar47 + lVar46;
            }
            break;
          case 6:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_SHORT);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT);
            local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 + iVar38) +
                                               lVar44 * 2);
            deRandom_init(&random.m_rnd,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar43 = 0;
            uVar32 = uVar12 & 0xffffffff;
            if ((int)uVar21 < 1) {
              uVar32 = uVar43;
            }
            uVar21 = 0;
            if (0 < (int)uVar36) {
              uVar21 = uVar36;
            }
            while (uVar36 = (uint)uVar43, uVar36 != uVar21) {
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                UVar19 = gls::(anonymous_namespace)::
                         getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_short>>
                                   (&random.m_rnd,(unsigned_short)GVar54.type,GVar55.field_1._0_2_);
                components[uVar43].m_value = UVar19.m_value;
                if ((uVar36 != 0) &&
                   ((ushort)(UVar19.m_value - *(short *)((long)retVal.m_data + uVar43 * 2)) < 0x400)
                   ) {
                  UVar19 = gls::(anonymous_namespace)::
                           getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_short>>
                                     (&random.m_rnd,(unsigned_short)GVar54.type,GVar55.field_1._0_2_
                                     );
                  components[uVar43].m_value = UVar19.m_value;
                }
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(deFloat16 *)((long)retVal.m_data + uVar43 * 2) = components[uVar43].m_value;
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(deFloat16 *)(pcVar47 + uVar43 * 2) = components[uVar43].m_value;
              }
              pcVar47 = pcVar47 + lVar46;
              uVar43 = (ulong)(uVar36 + 1);
            }
            break;
          case 7:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_INT);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_INT);
            local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 + iVar38) +
                                               lVar44 * 4);
            deRandom_init((deRandom *)&retVal,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar42 = 0;
            uVar32 = 0;
            if (0 < (int)uVar21) {
              uVar32 = uVar12 & 0xffffffff;
            }
            uVar21 = 0;
            if (0 < (int)uVar36) {
              uVar21 = uVar36;
            }
            for (; uVar42 != uVar21; uVar42 = uVar42 + 1) {
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                IVar27 = gls::(anonymous_namespace)::
                         getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<int>>
                                   ((deRandom *)&retVal,(Int)GVar54.type,GVar55.field_1._0_4_);
                *(int *)(components + uVar43 * 2) = IVar27.m_value;
                if ((uVar42 != 0) &&
                   ((IVar27.m_value - (&random.m_rnd.x)[uVar43] & 0x7c000000) == 0)) {
                  IVar27 = gls::(anonymous_namespace)::
                           getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<int>>
                                     ((deRandom *)&retVal,(Int)GVar54.type,GVar55.field_1._0_4_);
                  *(int *)(components + uVar43 * 2) = IVar27.m_value;
                }
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                (&random.m_rnd.x)[uVar43] = *(deUint32 *)(components + uVar43 * 2);
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(undefined4 *)(pcVar47 + uVar43 * 4) = *(undefined4 *)(components + uVar43 * 2);
              }
              pcVar47 = pcVar47 + lVar46;
            }
            break;
          case 8:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_UNSIGNED_INT);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT);
            local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 + iVar38) +
                                               lVar44 * 4);
            deRandom_init((deRandom *)&retVal,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar42 = 0;
            uVar32 = 0;
            if (0 < (int)uVar21) {
              uVar32 = uVar12 & 0xffffffff;
            }
            uVar21 = 0;
            if (0 < (int)uVar36) {
              uVar21 = uVar36;
            }
            for (; uVar42 != uVar21; uVar42 = uVar42 + 1) {
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                UVar29 = gls::(anonymous_namespace)::
                         getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_int>>
                                   ((deRandom *)&retVal,(Uint)GVar54.type,GVar55.field_1._0_4_);
                *(uint *)(components + uVar43 * 2) = UVar29.m_value;
                if ((uVar42 != 0) && (UVar29.m_value - (&random.m_rnd.x)[uVar43] < 0x4000000)) {
                  UVar29 = gls::(anonymous_namespace)::
                           getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_int>>
                                     ((deRandom *)&retVal,(Uint)GVar54.type,GVar55.field_1._0_4_);
                  *(uint *)(components + uVar43 * 2) = UVar29.m_value;
                }
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                (&random.m_rnd.x)[uVar43] = *(deUint32 *)(components + uVar43 * 2);
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(undefined4 *)(pcVar47 + uVar43 * 4) = *(undefined4 *)(components + uVar43 * 2);
              }
              pcVar47 = pcVar47 + lVar46;
            }
            break;
          case 9:
            GVar54 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_HALF);
            GVar55 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_HALF);
            local_2d0 = (char *)operator_new__((long)(int)((uVar36 - 1) * local_2e0 + iVar38) +
                                               lVar44 * 2);
            deRandom_init(&random.m_rnd,dVar45);
            pcVar47 = local_2d0 + lVar37;
            uVar42 = 0;
            uVar32 = 0;
            if (0 < (int)uVar21) {
              uVar32 = uVar12 & 0xffffffff;
            }
            uVar21 = 0;
            if (0 < (int)uVar36) {
              uVar21 = uVar36;
            }
            for (; uVar42 != uVar21; uVar42 = uVar42 + 1) {
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                HVar18 = anon_unknown_1::getRandom<deqp::gls::(anonymous_namespace)::GLValue::Half>
                                   (&random.m_rnd,(deFloat16)GVar54.type,GVar55.field_1._0_2_);
                components[uVar43].m_value = HVar18.m_value;
                if (uVar42 != 0) {
                  fVar51 = anon_unknown_1::GLValue::Half::halfToFloat(HVar18.m_value);
                  fVar53 = anon_unknown_1::GLValue::Half::halfToFloat
                                     (*(deFloat16 *)((long)retVal.m_data + uVar43 * 2));
                  HVar18 = anon_unknown_1::GLValue::Half::create(fVar51 - fVar53);
                  fVar51 = anon_unknown_1::GLValue::Half::halfToFloat(HVar18.m_value);
                  local_1fa = anon_unknown_1::GLValue::Half::create(ABS(fVar51));
                  local_1fc = anon_unknown_1::GLValue::Half::create(4.0);
                  bVar34 = anon_unknown_1::GLValue::Half::operator<(&local_1fa,&local_1fc);
                  if (bVar34) {
                    HVar18 = anon_unknown_1::
                             getRandom<deqp::gls::(anonymous_namespace)::GLValue::Half>
                                       (&random.m_rnd,(deFloat16)GVar54.type,GVar55.field_1._0_2_);
                    components[uVar43].m_value = HVar18.m_value;
                  }
                }
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(deFloat16 *)((long)retVal.m_data + uVar43 * 2) = components[uVar43].m_value;
              }
              for (uVar43 = 0; uVar32 != uVar43; uVar43 = uVar43 + 1) {
                *(deFloat16 *)(pcVar47 + uVar43 * 2) = components[uVar43].m_value;
              }
              pcVar47 = pcVar47 + lVar46;
            }
            break;
          default:
            local_2d0 = (char *)0x0;
          }
        }
        SVar3 = attribSpec.storage;
        AttributePack::newArray(this->m_glArrayPack,attribSpec.storage);
        AttributePack::newArray(this->m_rrArrayPack,SVar3);
        pAVar33 = AttributePack::getArray(this->m_glArrayPack,i_00);
        sVar40 = lVar37 + iVar23 + (local_2c8 - 1) * lVar46;
        usage = attribSpec.usage;
        anon_unknown_1::AttributeArray::data(pAVar33,TARGET_ARRAY,sVar40,local_2d0,attribSpec.usage)
        ;
        pAVar33 = AttributePack::getArray(this->m_rrArrayPack,i_00);
        anon_unknown_1::AttributeArray::data(pAVar33,TARGET_ARRAY,sVar40,local_2d0,usage);
        pAVar33 = AttributePack::getArray(this->m_glArrayPack,i_00);
        iVar22 = attribSpec.offset;
        iVar38 = attribSpec.componentCount;
        IVar10 = attribSpec.inputType;
        OVar11 = attribSpec.outputType;
        bVar34 = attribSpec.normalize;
        iVar23 = attribSpec.stride;
        iVar13 = attribSpec.instanceDivisor;
        bVar14 = attribSpec.bgraComponentOrder;
        bVar35 = (bool)(lVar41 == 0 | uVar7._5_1_ & 1U);
        pAVar33->m_componentCount = attribSpec.componentCount;
        pAVar33->m_bound = true;
        pAVar33->m_inputType = attribSpec.inputType;
        pAVar33->m_outputType = attribSpec.outputType;
        pAVar33->m_normalize = attribSpec.normalize;
        pAVar33->m_stride = attribSpec.stride;
        pAVar33->m_offset = attribSpec.offset;
        *(undefined8 *)&(pAVar33->m_defaultAttrib).v = 0;
        *(undefined8 *)((long)&(pAVar33->m_defaultAttrib).v + 8) = 0;
        pAVar33->m_instanceDivisor = attribSpec.instanceDivisor;
        pAVar33->m_isPositionAttr = bVar35;
        pAVar33->m_bgraOrder = attribSpec.bgraComponentOrder;
        pAVar33 = AttributePack::getArray(this->m_rrArrayPack,i_00);
        pAVar33->m_componentCount = iVar38;
        pAVar33->m_bound = true;
        pAVar33->m_inputType = IVar10;
        pAVar33->m_outputType = OVar11;
        pAVar33->m_normalize = bVar34;
        pAVar33->m_stride = iVar23;
        pAVar33->m_offset = iVar22;
        *(undefined8 *)&(pAVar33->m_defaultAttrib).v = 0;
        *(undefined8 *)((long)&(pAVar33->m_defaultAttrib).v + 8) = 0;
        pAVar33->m_instanceDivisor = iVar13;
        pAVar33->m_isPositionAttr = bVar35;
        pAVar33->m_bgraOrder = bVar14;
        if (local_2d0 != (char *)0x0) {
          operator_delete__(local_2d0);
        }
      }
    }
    if (bVar50) {
      AttributePack::updateProgram(this->m_glArrayPack);
      AttributePack::updateProgram(this->m_rrArrayPack);
    }
    if ((uVar30 & 1) == 0) {
      iVar38 = (int)local_1e8;
      AttributePack::render
                (this->m_glArrayPack,spec->primitive,spec->drawMethod,spec->first,iVar38,
                 INDEXTYPE_LAST,(void *)0x0,0,0,spec->instanceCount,spec->indirectOffset,0,
                 coordScale,colorScale,(AttributeArray *)0x0);
      AttributePack::render
                (this->m_rrArrayPack,spec->primitive,spec->drawMethod,spec->first,iVar38,
                 INDEXTYPE_LAST,(void *)0x0,0,0,spec->instanceCount,spec->indirectOffset,0,
                 coordScale,colorScale,(AttributeArray *)0x0);
    }
    else {
      dVar45 = DrawTestSpec::hash(spec);
      IVar2 = spec->indexType;
      iVar38 = DrawTestSpec::indexTypeSize::size[(int)IVar2];
      lVar41 = (long)spec->indexPointerOffset;
      local_210 = (int)uVar31;
      if ((long)(int)IVar2 == 2) {
        local_2b8 = (char *)operator_new__(lVar41 + (long)local_210 * 4);
        deRandom_init(&random.m_rnd,dVar45);
        uVar43 = 0;
        uVar32 = 0;
        if (0 < local_210) {
          uVar32 = uVar31 & 0xffffffff;
        }
        UVar29.m_value = 0xffffffff;
        uVar30 = 0xffffffff;
        for (; uVar21 = UVar29.m_value, uVar32 != uVar43; uVar43 = uVar43 + 1) {
          UVar29 = gls::(anonymous_namespace)::
                   getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_int>>
                             (&random.m_rnd,min,max);
          uVar36 = (UVar29.m_value == uVar21) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar36 <= max.m_value) {
            UVar29.m_value = uVar36;
          }
          uVar30 = (UVar29.m_value == uVar30) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar30 <= max.m_value) {
            UVar29.m_value = uVar30;
          }
          uVar30 = (UVar29.m_value == uVar21) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar30 <= max.m_value) {
            UVar29.m_value = uVar30;
          }
          *(uint *)(local_2b8 + uVar43 * 4 + lVar41) = (int)local_1e0 + UVar29.m_value;
          uVar30 = uVar21;
        }
      }
      else if (IVar2 == INDEXTYPE_SHORT) {
        local_2b8 = (char *)operator_new__(lVar41 + (long)local_210 * 2);
        deRandom_init(&random.m_rnd,dVar45);
        uVar43 = 0;
        uVar32 = 0;
        if (0 < local_210) {
          uVar32 = uVar31 & 0xffffffff;
        }
        UVar29.m_value = 0xffffffff;
        uVar30 = 0xffffffff;
        for (; uVar21 = UVar29.m_value, uVar32 != uVar43; uVar43 = uVar43 + 1) {
          UVar29 = gls::(anonymous_namespace)::
                   getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_int>>
                             (&random.m_rnd,min,max);
          uVar36 = (UVar29.m_value == uVar21) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar36 <= max.m_value) {
            UVar29.m_value = uVar36;
          }
          uVar30 = (UVar29.m_value == uVar30) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar30 <= max.m_value) {
            UVar29.m_value = uVar30;
          }
          uVar30 = (UVar29.m_value == uVar21) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar30 <= max.m_value) {
            UVar29.m_value = uVar30;
          }
          *(short *)(local_2b8 + uVar43 * 2 + lVar41) = (short)local_1e0 + (short)UVar29.m_value;
          uVar30 = uVar21;
        }
      }
      else if (IVar2 == INDEXTYPE_BYTE) {
        local_2b8 = (char *)operator_new__(local_210 + lVar41);
        deRandom_init(&random.m_rnd,dVar45);
        uVar43 = 0;
        uVar32 = 0;
        if (0 < local_210) {
          uVar32 = uVar31 & 0xffffffff;
        }
        UVar29.m_value = 0xffffffff;
        uVar30 = 0xffffffff;
        for (; uVar21 = UVar29.m_value, uVar32 != uVar43; uVar43 = uVar43 + 1) {
          UVar29 = gls::(anonymous_namespace)::
                   getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_int>>
                             (&random.m_rnd,min,max);
          uVar36 = (UVar29.m_value == uVar21) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar36 <= max.m_value) {
            UVar29.m_value = uVar36;
          }
          uVar30 = (UVar29.m_value == uVar30) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar30 <= max.m_value) {
            UVar29.m_value = uVar30;
          }
          uVar30 = (UVar29.m_value == uVar21) + UVar29.m_value;
          UVar29.m_value = min.m_value;
          if (uVar30 <= max.m_value) {
            UVar29.m_value = uVar30;
          }
          local_2b8[uVar43 + lVar41] = (char)local_1e0 + (char)UVar29.m_value;
          uVar30 = uVar21;
        }
      }
      else {
        local_2b8 = (char *)0x0;
      }
      SVar3 = spec->indexStorage;
      pcVar47 = (char *)0x0;
      if (SVar3 == STORAGE_USER) {
        pcVar47 = local_2b8;
      }
      iVar22 = spec->indexPointerOffset;
      pAVar33 = (AttributeArray *)operator_new(0x58);
      anon_unknown_1::AttributeArray::AttributeArray(pAVar33,SVar3,this->m_glesContext);
      attribSpec._0_8_ = pAVar33;
      this_01 = (AttributeArray *)operator_new(0x58);
      anon_unknown_1::AttributeArray::AttributeArray
                (this_01,spec->indexStorage,&this->m_refContext->super_Context);
      sVar40 = uVar31 * (long)iVar38 + lVar41;
      random.m_rnd._0_8_ = this_01;
      anon_unknown_1::AttributeArray::data
                (pAVar33,TARGET_ELEMENT_ARRAY,sVar40,local_2b8,USAGE_STATIC_DRAW);
      anon_unknown_1::AttributeArray::data
                (this_01,TARGET_ELEMENT_ARRAY,sVar40,local_2b8,USAGE_STATIC_DRAW);
      AttributePack::render
                (this->m_glArrayPack,spec->primitive,spec->drawMethod,0,(int)local_1e8,
                 spec->indexType,pcVar47 + iVar22,spec->indexMin,spec->indexMax,spec->instanceCount,
                 spec->indirectOffset,spec->baseVertex,coordScale,colorScale,pAVar33);
      AttributePack::render
                (this->m_rrArrayPack,spec->primitive,spec->drawMethod,0,(int)local_1e8,
                 spec->indexType,pcVar47 + iVar22,spec->indexMin,spec->indexMax,spec->instanceCount,
                 spec->indirectOffset,spec->baseVertex,coordScale,colorScale,
                 (AttributeArray *)random.m_rnd._0_8_);
      if (local_2b8 != (char *)0x0) {
        operator_delete__(local_2b8);
      }
      de::details::
      UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      ::~UniqueBase((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                     *)&random);
      de::details::
      UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
      ::~UniqueBase((UniqueBase<deqp::gls::(anonymous_namespace)::AttributeArray,_de::DefaultDeleter<deqp::gls::(anonymous_namespace)::AttributeArray>_>
                     *)&attribSpec);
    }
  }
  else {
LAB_014fc627:
    log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    if (iVar38 == 0) goto LAB_014fc7c0;
    IVar39 = STOP;
    sectionEmitter.m_enabled = false;
    sectionEmitter.m_log = log;
    if (iVar38 != 1) goto LAB_014fe0d8;
    bVar50 = compare(this,spec->primitive);
    if (!bVar50) {
      CVar20 = DrawTestSpec::isCompatibilityTest(spec);
      if (CVar20 == COMPATIBILITY_UNALIGNED_STRIDE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&attribSpec,"Failed to draw with unaligned stride.",
                   (allocator<char> *)&random);
        tcu::ResultCollector::addResult
                  (&this->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)&attribSpec);
      }
      else if (CVar20 == COMPATIBILITY_UNALIGNED_OFFSET) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&attribSpec,"Failed to draw with unaligned buffers.",
                   (allocator<char> *)&random);
        tcu::ResultCollector::addResult
                  (&this->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)&attribSpec);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&attribSpec,"Image comparison failed.",(allocator<char> *)&random);
        tcu::ResultCollector::addResult(&this->m_result,QP_TEST_RESULT_FAIL,(string *)&attribSpec);
      }
      std::__cxx11::string::~string((string *)&attribSpec);
    }
  }
  tcu::ResultCollector::setTestContextResult
            (&this->m_result,(this->super_TestCase).super_TestNode.m_testCtx);
  IVar39 = (IterateResult)((long)iVar1 + 1 != testIterations * 2);
  this->m_iteration = this->m_iteration + 1;
LAB_014fe0d8:
  anon_unknown_1::IterationLogSectionEmitter::~IterationLogSectionEmitter(&sectionEmitter);
  return IVar39;
}

Assistant:

DrawTest::IterateResult DrawTest::iterate (void)
{
	const int					specNdx			= (m_iteration / 2);
	const bool					drawStep		= (m_iteration % 2) == 0;
	const bool					compareStep		= (m_iteration % 2) == 1;
	const IterateResult			iterateResult	= ((size_t)m_iteration + 1 == m_specs.size()*2) ? (STOP) : (CONTINUE);
	const DrawTestSpec&			spec			= m_specs[specNdx];
	const bool					updateProgram	= (m_iteration == 0) || (drawStep && !checkSpecsShaderCompatible(m_specs[specNdx], m_specs[specNdx-1])); // try to use the same shader in all iterations
	IterationLogSectionEmitter	sectionEmitter	(m_testCtx.getLog(), specNdx, m_specs.size(), m_iteration_descriptions[specNdx], drawStep && m_specs.size()!=1);

	if (drawStep)
	{
		const MethodInfo	methodInfo				= getMethodInfo(spec.drawMethod);
		const bool			indexed					= methodInfo.indexed;
		const bool			instanced				= methodInfo.instanced;
		const bool			ranged					= methodInfo.ranged;
		const bool			hasFirst				= methodInfo.first;
		const bool			hasBaseVtx				= methodInfo.baseVertex;

		const size_t		primitiveElementCount	= getElementCount(spec.primitive, spec.primitiveCount);						// !< elements to be drawn
		const int			indexMin				= (ranged) ? (spec.indexMin) : (0);
		const int			firstAddition			= (hasFirst) ? (spec.first) : (0);
		const int			baseVertexAddition		= (hasBaseVtx && spec.baseVertex > 0) ? ( spec.baseVertex) : (0);			// spec.baseVertex > 0 => Create bigger attribute buffer
		const int			indexBase				= (hasBaseVtx && spec.baseVertex < 0) ? (-spec.baseVertex) : (0);			// spec.baseVertex < 0 => Create bigger indices
		const size_t		elementCount			= primitiveElementCount + indexMin + firstAddition + baseVertexAddition;	// !< elements in buffer (buffer should have at least primitiveElementCount ACCESSIBLE (index range, first) elements)
		const int			maxElementIndex			= (int)primitiveElementCount + indexMin + firstAddition - 1;
		const int			indexMax				= de::max(0, (ranged) ? (de::clamp<int>(spec.indexMax, 0, maxElementIndex)) : (maxElementIndex));
		float				coordScale				= getCoordScale(spec);
		float				colorScale				= getColorScale(spec);

		rr::GenericVec4		nullAttribValue;

		// Log info
		m_testCtx.getLog() << TestLog::Message << spec.getMultilineDesc() << TestLog::EndMessage;
		m_testCtx.getLog() << TestLog::Message << TestLog::EndMessage; // extra line for clarity

		// Data

		m_glArrayPack->clearArrays();
		m_rrArrayPack->clearArrays();

		for (int attribNdx = 0; attribNdx < (int)spec.attribs.size(); attribNdx++)
		{
			DrawTestSpec::AttributeSpec attribSpec		= spec.attribs[attribNdx];
			const bool					isPositionAttr	= (attribNdx == 0) || (attribSpec.additionalPositionAttribute);

			if (attribSpec.useDefaultAttribute)
			{
				const int		seed		= 10 * attribSpec.hash() + 100 * spec.hash() + attribNdx;
				rr::GenericVec4 attribValue = RandomArrayGenerator::generateAttributeValue(seed, attribSpec.inputType);

				m_glArrayPack->newArray(DrawTestSpec::STORAGE_USER);
				m_rrArrayPack->newArray(DrawTestSpec::STORAGE_USER);

				m_glArrayPack->getArray(attribNdx)->setupArray(false, 0, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, false, 0, 0, attribValue, isPositionAttr, false);
				m_rrArrayPack->getArray(attribNdx)->setupArray(false, 0, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, false, 0, 0, attribValue, isPositionAttr, false);
			}
			else
			{
				const int					seed					= attribSpec.hash() + 100 * spec.hash() + attribNdx;
				const size_t				elementSize				= attribSpec.componentCount * DrawTestSpec::inputTypeSize(attribSpec.inputType);
				const size_t				stride					= (attribSpec.stride == 0) ? (elementSize) : (attribSpec.stride);
				const size_t				evaluatedElementCount	= (instanced && attribSpec.instanceDivisor > 0) ? (spec.instanceCount / attribSpec.instanceDivisor + 1) : (elementCount);
				const size_t				referencedElementCount	= (ranged) ? (de::max<size_t>(evaluatedElementCount, spec.indexMax + 1)) : (evaluatedElementCount);
				const size_t				bufferSize				= attribSpec.offset + stride * (referencedElementCount - 1) + elementSize;
				const char*					data					= RandomArrayGenerator::generateArray(seed, (int)referencedElementCount, attribSpec.componentCount, attribSpec.offset, (int)stride, attribSpec.inputType);

				try
				{
					m_glArrayPack->newArray(attribSpec.storage);
					m_rrArrayPack->newArray(attribSpec.storage);

					m_glArrayPack->getArray(attribNdx)->data(DrawTestSpec::TARGET_ARRAY, bufferSize, data, attribSpec.usage);
					m_rrArrayPack->getArray(attribNdx)->data(DrawTestSpec::TARGET_ARRAY, bufferSize, data, attribSpec.usage);

					m_glArrayPack->getArray(attribNdx)->setupArray(true, attribSpec.offset, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, attribSpec.normalize, attribSpec.stride, attribSpec.instanceDivisor, nullAttribValue, isPositionAttr, attribSpec.bgraComponentOrder);
					m_rrArrayPack->getArray(attribNdx)->setupArray(true, attribSpec.offset, attribSpec.componentCount, attribSpec.inputType, attribSpec.outputType, attribSpec.normalize, attribSpec.stride, attribSpec.instanceDivisor, nullAttribValue, isPositionAttr, attribSpec.bgraComponentOrder);

					delete [] data;
					data = NULL;
				}
				catch (...)
				{
					delete [] data;
					throw;
				}
			}
		}

		// Shader program
		if (updateProgram)
		{
			m_glArrayPack->updateProgram();
			m_rrArrayPack->updateProgram();
		}

		// Draw
		try
		{
			// indices
			if (indexed)
			{
				const int		seed				= spec.hash();
				const size_t	indexElementSize	= DrawTestSpec::indexTypeSize(spec.indexType);
				const size_t	indexArraySize		= spec.indexPointerOffset + indexElementSize * elementCount;
				const char*		indexArray			= RandomArrayGenerator::generateIndices(seed, (int)elementCount, spec.indexType, spec.indexPointerOffset, indexMin, indexMax, indexBase);
				const char*		indexPointerBase	= (spec.indexStorage == DrawTestSpec::STORAGE_USER) ? (indexArray) : ((char*)DE_NULL);
				const char*		indexPointer		= indexPointerBase + spec.indexPointerOffset;

				de::UniquePtr<AttributeArray> glArray	(new AttributeArray(spec.indexStorage, *m_glesContext));
				de::UniquePtr<AttributeArray> rrArray	(new AttributeArray(spec.indexStorage, *m_refContext));

				try
				{
					glArray->data(DrawTestSpec::TARGET_ELEMENT_ARRAY, indexArraySize, indexArray, DrawTestSpec::USAGE_STATIC_DRAW);
					rrArray->data(DrawTestSpec::TARGET_ELEMENT_ARRAY, indexArraySize, indexArray, DrawTestSpec::USAGE_STATIC_DRAW);

					m_glArrayPack->render(spec.primitive, spec.drawMethod, 0, (int)primitiveElementCount, spec.indexType, indexPointer, spec.indexMin, spec.indexMax, spec.instanceCount, spec.indirectOffset, spec.baseVertex, coordScale, colorScale, glArray.get());
					m_rrArrayPack->render(spec.primitive, spec.drawMethod, 0, (int)primitiveElementCount, spec.indexType, indexPointer, spec.indexMin, spec.indexMax, spec.instanceCount, spec.indirectOffset, spec.baseVertex, coordScale, colorScale, rrArray.get());

					delete [] indexArray;
					indexArray = NULL;
				}
				catch (...)
				{
					delete [] indexArray;
					throw;
				}
			}
			else
			{
				m_glArrayPack->render(spec.primitive, spec.drawMethod, spec.first, (int)primitiveElementCount, DrawTestSpec::INDEXTYPE_LAST, DE_NULL, 0, 0, spec.instanceCount, spec.indirectOffset, 0, coordScale, colorScale, DE_NULL);
				m_rrArrayPack->render(spec.primitive, spec.drawMethod, spec.first, (int)primitiveElementCount, DrawTestSpec::INDEXTYPE_LAST, DE_NULL, 0, 0, spec.instanceCount, spec.indirectOffset, 0, coordScale, colorScale, DE_NULL);
			}
		}
		catch (glu::Error& err)
		{
			// GL Errors are ok if the mode is not properly aligned

			const DrawTestSpec::CompatibilityTestType ctype = spec.isCompatibilityTest();

			m_testCtx.getLog() << TestLog::Message << "Got error: " << err.what() << TestLog::EndMessage;

			if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				throw;
		}
	}
	else if (compareStep)
	{
		if (!compare(spec.primitive))
		{
			const DrawTestSpec::CompatibilityTestType ctype = spec.isCompatibilityTest();

			if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (ctype == DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
				m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				m_result.addResult(QP_TEST_RESULT_FAIL, "Image comparison failed.");
		}
	}
	else
	{
		DE_ASSERT(false);
		return STOP;
	}

	m_result.setTestContextResult(m_testCtx);

	m_iteration++;
	return iterateResult;
}